

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcAxis2Placement3D::IfcAxis2Placement3D(IfcAxis2Placement3D *this)

{
  IfcAxis2Placement3D *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x68,"IfcAxis2Placement3D");
  IfcPlacement::IfcPlacement(&this->super_IfcPlacement,&PTR_construction_vtable_24__00f05588);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D,_2UL> *)
             &(this->super_IfcPlacement).field_0x38,&PTR_construction_vtable_24__00f05600);
  (this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf054d0;
  *(undefined8 *)&this->field_0x68 = 0xf05570;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf054f8;
  *(undefined8 *)
   &(this->super_IfcPlacement).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf05520;
  *(undefined8 *)&(this->super_IfcPlacement).field_0x38 = 0xf05548;
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Maybe
            ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *)
             &(this->super_IfcPlacement).field_0x48);
  STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Maybe
            (&this->RefDirection);
  return;
}

Assistant:

IfcAxis2Placement3D() : Object("IfcAxis2Placement3D") {}